

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_file_bag.c
# Opt level: O3

ion_err_t lfb_update_all(ion_lfb_t *bag,ion_file_offset_t offset,uint num_bytes,ion_byte_t *to_write
                        ,ion_result_count_t *count)

{
  ion_err_t iVar1;
  long in_RAX;
  ion_file_offset_t next;
  long local_38;
  
  if (offset == -1) {
    return '\0';
  }
  local_38 = in_RAX;
  while( true ) {
    iVar1 = ion_fread_at(bag->file_handle,offset,8,(ion_byte_t *)&local_38);
    if (iVar1 != '\0') {
      return iVar1;
    }
    iVar1 = ion_fwrite_at(bag->file_handle,offset + 8,num_bytes,to_write);
    if (iVar1 != '\0') break;
    if (count != (ion_result_count_t *)0x0) {
      *count = *count + 1;
    }
    offset = local_38;
    if (local_38 == -1) {
      return '\0';
    }
  }
  return iVar1;
}

Assistant:

ion_err_t
lfb_update_all(
	ion_lfb_t			*bag,
	ion_file_offset_t	offset,
	unsigned int		num_bytes,
	ion_byte_t			*to_write,
	ion_result_count_t	*count
) {
	ion_err_t			error;
	ion_file_offset_t	next;

	while (ION_LFB_NULL != offset) {
		error = ion_fread_at(bag->file_handle, offset, sizeof(ion_file_offset_t), (ion_byte_t *) &next);

		if (err_ok != error) {
			return error;
		}

		error = lfb_update(bag, offset, num_bytes, to_write, NULL);

		if (err_ok != error) {
			return error;
		}

		if (NULL != count) {
			(*count)++;
		}

		offset = next;
	}

	return err_ok;
}